

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageClipper.cpp
# Opt level: O3

void countCoverage(string *filename)

{
  int iVar1;
  char cVar2;
  int iVar3;
  _Elt_pointer ppVar4;
  long lVar5;
  long *plVar6;
  ostream *poVar7;
  runtime_error *this;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  BamReader bamreader;
  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  positions;
  BamAlignment alignment;
  BamReader aBStack_1e8 [8];
  pair<int,_int> local_1e0;
  _Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_1d8;
  char *local_188;
  long local_180;
  char local_178 [156];
  int local_dc;
  
  BamTools::BamReader::BamReader(aBStack_1e8);
  cVar2 = BamTools::BamReader::Open((string *)aBStack_1e8);
  if (cVar2 == '\0') {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_188,local_180);
    std::endl<char,std::char_traits<char>>(poVar7);
    if (local_188 != local_178) {
      operator_delete(local_188);
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Couldn\'t open Bamfile");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BamTools::BamAlignment::BamAlignment((BamAlignment *)&local_188);
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (pair<int,_int> *)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_initialize_map
            (&local_1d8,0);
  bVar10 = true;
  iVar1 = 0;
  while (iVar9 = iVar1, cVar2 = BamTools::BamReader::GetNextAlignment((BamAlignment *)aBStack_1e8),
        iVar1 = local_dc, cVar2 != '\0') {
    if (bVar10) {
      lVar5 = BamTools::BamAlignment::GetEndPosition(SUB81(&local_188,0),false);
      local_1e0 = (pair<int,_int>)((ulong)(iVar1 + 1) | lVar5 << 0x20);
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_push_back_aux<std::pair<int,int>>
                  ((deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_1d8,
                   &local_1e0);
      }
      else {
        *local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1e0;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      bVar10 = false;
      iVar1 = 1;
    }
    else {
      iVar3 = BamTools::BamAlignment::GetEndPosition(SUB81(&local_188,0),false);
      ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      while ((ppVar4 != local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur &&
             ((local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->second <= iVar1))) {
        if (local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_1d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first);
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          ppVar4 = local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
      }
      local_1e0.second = iVar3;
      local_1e0.first = iVar1 + 1;
      if (ppVar4 == local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_push_back_aux<std::pair<int,int>>
                  ((deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_1d8,
                   &local_1e0);
      }
      else {
        *ppVar4 = local_1e0;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar8 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
              ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x40 +
              ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3);
      iVar1 = (int)uVar8;
      if (uVar8 <= (ulong)(long)iVar9) {
        iVar1 = iVar9;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Maximum depth: ",0xf);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Deque_base
            (&local_1d8);
  BamTools::BamAlignment::~BamAlignment((BamAlignment *)&local_188);
  BamTools::BamReader::~BamReader(aBStack_1e8);
  return;
}

Assistant:

void countCoverage(string filename) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;

    int currentStart =0;
    int currentEnd =0;
    int maxDepth =0;
    std::queue<std::pair<int,int>> positions;
    bool firstAlignment = true;

     while (bamreader.GetNextAlignment(alignment)){

        //Working with the first alignment
        if(firstAlignment){
            positions.push(std::make_pair((alignment.Position+1),alignment.GetEndPosition()));
            maxDepth = 1;
            firstAlignment = false;
            continue;
        }

        //For all alignments other than the first alignment

        //Assigning the positions
        currentStart = (alignment.Position+1);
        currentEnd = alignment.GetEndPosition();

        //cout<<"current start1: "<<currentStartPair1<<" end1: "<<currentEndPair1<<endl;

        while(!positions.empty()){
            //cout<<"start1: "<<firstMatePositions.front().first<<" end1: "<<firstMatePositions.front().second<<endl;
            int endPair1 = positions.front().second;
            if(currentStart>endPair1 ){
                //cout<<"pop"<<endl;
                positions.pop();
                continue;
            }
            break;
        }

        positions.push(std::make_pair(currentStart,currentEnd));

        if((positions.size())>maxDepth){
            maxDepth = positions.size();

        }
    }
     cout<<"Maximum depth: "<<maxDepth<<endl;

}